

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O1

void duckdb::SortedAggregateFunction::SimpleUpdate
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,
               data_ptr_t state,idx_t count)

{
  DataChunk sort_input;
  DataChunk arg_input;
  SortedAggregateBindData order_bind;
  DataChunk local_280;
  DataChunk local_240;
  SortedAggregateBindData local_200;
  
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  SortedAggregateBindData::SortedAggregateBindData
            (&local_200,(SortedAggregateBindData *)(aggr_input_data->bind_data).ptr);
  DataChunk::DataChunk(&local_240);
  DataChunk::DataChunk(&local_280);
  ProjectInputs(inputs,&local_200,input_count,count,&local_240,&local_280);
  SortedAggregateState::Update((SortedAggregateState *)state,aggr_input_data,&local_280,&local_240);
  DataChunk::~DataChunk(&local_280);
  DataChunk::~DataChunk(&local_240);
  local_200.super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__SortedAggregateBindData_024936a0;
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
  ~vector(&local_200.sort_funcs.
           super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
         );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&local_200.sort_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_200.orders.
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>);
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
  ~vector(&local_200.arg_funcs.
           super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
         );
  if (local_200.bind_info.
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>)
      0x0) {
    (*(*(_func_int ***)
        local_200.bind_info.
        super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
        super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
        super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl)[1])();
  }
  local_200.bind_info.
  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
       (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>
       )0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&local_200.arg_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_200.function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_200.function.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_200.function.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_200.function.super_BaseScalarFunction);
  FunctionData::~FunctionData(&local_200.super_FunctionData);
  return;
}

Assistant:

static void SimpleUpdate(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, data_ptr_t state,
	                         idx_t count) {
		const auto order_bind = aggr_input_data.bind_data->Cast<SortedAggregateBindData>();
		DataChunk arg_input;
		DataChunk sort_input;
		ProjectInputs(inputs, order_bind, input_count, count, arg_input, sort_input);

		const auto order_state = reinterpret_cast<SortedAggregateState *>(state);
		order_state->Update(aggr_input_data, sort_input, arg_input);
	}